

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<PClassWeapon_*,_PClassWeapon_*>::~TArray(TArray<PClassWeapon_*,_PClassWeapon_*> *this)

{
  TArray<PClassWeapon_*,_PClassWeapon_*> *this_local;
  
  if (this->Array != (PClassWeapon **)0x0) {
    if (this->Count != 0) {
      DoDelete(this,0,this->Count - 1);
    }
    M_Free(this->Array);
    this->Array = (PClassWeapon **)0x0;
    this->Count = 0;
    this->Most = 0;
  }
  return;
}

Assistant:

~TArray ()
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
			Array = NULL;
			Count = 0;
			Most = 0;
		}
	}